

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdf.cpp
# Opt level: O2

void sdf_tools::exportSdf(module *m)

{
  shared_class<Sdf> pysdf;
  class_<sdf_tools::sdf::Sdf,_std::shared_ptr<sdf_tools::sdf::Sdf>_> cStack_a8;
  arg local_a0;
  class_<sdf_tools::sdf::SdfCapsule,_std::shared_ptr<sdf_tools::sdf::SdfCapsule>_> local_90;
  arg local_88;
  arg local_78;
  float local_64;
  arg_v local_60;
  
  pybind11::class_<sdf_tools::sdf::Sdf,_std::shared_ptr<sdf_tools::sdf::Sdf>_>::class_<char[30]>
            (&cStack_a8,(m->super_object).super_handle.m_ptr,"Sdf",
             (char (*) [30])"\n        Base sdf class.\n    ");
  local_60.super_arg.name = (char *)0x11;
  local_60.super_arg._8_8_ = 0;
  local_88.name = "r";
  local_88._8_1_ = 2;
  pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>::
  def<float(sdf_tools::sdf::Sdf::*)(sdf_tools::real3)const,pybind11::arg,char[130]>
            ((class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>> *)&cStack_a8,"at",
             (offset_in_Grid_to_subr *)&local_60,&local_88,
             (char (*) [130])
             "\n        Evaluate the SDF field at the given position.\n\n        Args:\n            r: The position where to evaluate the SDF.\n    "
            );
  pybind11::class_<sdf_tools::sdf::SdfBox,std::shared_ptr<sdf_tools::sdf::SdfBox>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[36]>
            ((class_<sdf_tools::sdf::SdfBox,std::shared_ptr<sdf_tools::sdf::SdfBox>> *)&local_78,
             (m->super_object).super_handle.m_ptr,"Box",&cStack_a8,
             (char (*) [36])"\n        Box aligned with axes\n    ");
  local_60.super_arg.name = "low";
  local_60.super_arg._8_1_ = 2;
  local_88.name = "high";
  local_88._8_1_ = 2;
  local_a0.name = "inside";
  local_a0._8_1_ = 2;
  pybind11::detail::initimpl::constructor<sdf_tools::real3,_sdf_tools::real3,_bool>::
  execute<pybind11::class_<sdf_tools::sdf::SdfBox,_std::shared_ptr<sdf_tools::sdf::SdfBox>_>,_pybind11::arg,_pybind11::arg,_pybind11::arg,_char[198],_0>
            ((class_<sdf_tools::sdf::SdfBox,_std::shared_ptr<sdf_tools::sdf::SdfBox>_> *)&local_78,
             &local_60.super_arg,&local_88,&local_a0,
             (char (*) [198])
             "\n\n            Args:\n                low: Lower corner of the box.\n                high: Upper corner of the box.\n                inside: ``True`` if the interior is inside the given shape.\n        "
            );
  pybind11::object::~object((object *)&local_78);
  pybind11::class_<sdf_tools::sdf::SdfCapsule,std::shared_ptr<sdf_tools::sdf::SdfCapsule>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[58]>
            ((class_<sdf_tools::sdf::SdfCapsule,std::shared_ptr<sdf_tools::sdf::SdfCapsule>> *)
             &local_90,(m->super_object).super_handle.m_ptr,"Capsule",&cStack_a8,
             (char (*) [58])"\n        Capsule defined by a segment and a radius.\n\n    ");
  local_60.super_arg.name = "start";
  local_60.super_arg._8_1_ = 2;
  local_88.name = "end";
  local_88._8_1_ = 2;
  local_a0.name = "radius";
  local_a0._8_1_ = 2;
  local_78.name = "inside";
  local_78._8_1_ = 2;
  pybind11::detail::initimpl::constructor<sdf_tools::real3,_sdf_tools::real3,_float,_bool>::
  execute<pybind11::class_<sdf_tools::sdf::SdfCapsule,_std::shared_ptr<sdf_tools::sdf::SdfCapsule>_>,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg,_char[257],_0>
            (&local_90,&local_60.super_arg,&local_88,&local_a0,&local_78,
             (char (*) [257])
             "\n\n            Args:\n                start: First end of the segment.\n                end:  Second end of the segment.\n                radius: Radius of the capsule.\n                inside: Whether the domain is inside the capsule or outside of it.\n        "
            );
  pybind11::object::~object((object *)&local_90);
  pybind11::class_<sdf_tools::sdf::SdfEdges,std::shared_ptr<sdf_tools::sdf::SdfEdges>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[65]>
            ((class_<sdf_tools::sdf::SdfEdges,std::shared_ptr<sdf_tools::sdf::SdfEdges>> *)&local_90
             ,(m->super_object).super_handle.m_ptr,"Edges",&cStack_a8,
             (char (*) [65])"\n        Closed polygon defined from edges in the xy plane.\n    ");
  local_88.name = "edges";
  local_88._8_1_ = 2;
  local_a0.name = "inside";
  local_a0._8_1_ = 2;
  local_64 = 2.8026e-44;
  local_78.name = "nsamples";
  local_78._8_1_ = 2;
  pybind11::arg::operator=(&local_60,&local_78,(int *)&local_64);
  pybind11::detail::initimpl::
  constructor<std::vector<sdf_tools::real2,_std::allocator<sdf_tools::real2>_>_&,_bool,_int>::
  execute<pybind11::class_<sdf_tools::sdf::SdfEdges,_std::shared_ptr<sdf_tools::sdf::SdfEdges>_>,_pybind11::arg,_pybind11::arg,_pybind11::arg_v,_char[258],_0>
            ((class_<sdf_tools::sdf::SdfEdges,_std::shared_ptr<sdf_tools::sdf::SdfEdges>_> *)
             &local_90,&local_88,&local_a0,&local_60,
             (char (*) [258])
             "\n\n            Args:\n                edges: List of vertices positions (2D).\n                inside: ``True`` if the interior is inside the given shape.\n                nsamples: Number of samples to find the sign of the SDF (more is more accurate).\n        "
            );
  pybind11::arg_v::~arg_v(&local_60);
  pybind11::object::~object((object *)&local_90);
  pybind11::class_<sdf_tools::sdf::SdfFromMesh,std::shared_ptr<sdf_tools::sdf::SdfFromMesh>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[36]>
            ((class_<sdf_tools::sdf::SdfFromMesh,std::shared_ptr<sdf_tools::sdf::SdfFromMesh>> *)
             &local_78,(m->super_object).super_handle.m_ptr,"FromMesh",&cStack_a8,
             (char (*) [36])"\n        Closed triangle mesh.\n    ");
  local_60.super_arg.name = "faces";
  local_60.super_arg._8_1_ = 2;
  local_88.name = "vertices";
  local_88._8_1_ = 2;
  local_a0.name = "inside";
  local_a0._8_1_ = 2;
  pybind11::detail::initimpl::
  constructor<std::vector<sdf_tools::int3,_std::allocator<sdf_tools::int3>_>,_std::vector<sdf_tools::real3,_std::allocator<sdf_tools::real3>_>,_bool>
  ::
  execute<pybind11::class_<sdf_tools::sdf::SdfFromMesh,_std::shared_ptr<sdf_tools::sdf::SdfFromMesh>_>,_pybind11::arg,_pybind11::arg,_pybind11::arg,_char[229],_0>
            ((class_<sdf_tools::sdf::SdfFromMesh,_std::shared_ptr<sdf_tools::sdf::SdfFromMesh>_> *)
             &local_78,&local_60.super_arg,&local_88,&local_a0,
             (char (*) [229])
             "\n\n            Args:\n                faces: List of vertex indices forming each face.\n                vertices: List of vertices positions (3D).\n                inside: ``True`` if the interior is inside the given shape.\n        "
            );
  pybind11::object::~object((object *)&local_78);
  pybind11::
  class_<sdf_tools::sdf::SdfPiecewisePipe,std::shared_ptr<sdf_tools::sdf::SdfPiecewisePipe>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[109]>
            ((class_<sdf_tools::sdf::SdfPiecewisePipe,std::shared_ptr<sdf_tools::sdf::SdfPiecewisePipe>>
              *)&local_78,(m->super_object).super_handle.m_ptr,"PiecewisePipe",&cStack_a8,
             (char (*) [109])
             "\n        The union of many connected capsules, forming a piecewise linear pipe with a constant radius.\n\n    "
            );
  local_60.super_arg.name = "vertices";
  local_60.super_arg._8_1_ = 2;
  local_88.name = "radius";
  local_88._8_1_ = 2;
  local_a0.name = "inside";
  local_a0._8_1_ = 2;
  pybind11::detail::initimpl::
  constructor<std::vector<sdf_tools::real3,_std::allocator<sdf_tools::real3>_>,_float,_bool>::
  execute<pybind11::class_<sdf_tools::sdf::SdfPiecewisePipe,_std::shared_ptr<sdf_tools::sdf::SdfPiecewisePipe>_>,_pybind11::arg,_pybind11::arg,_pybind11::arg,_char[236],_0>
            ((class_<sdf_tools::sdf::SdfPiecewisePipe,_std::shared_ptr<sdf_tools::sdf::SdfPiecewisePipe>_>
              *)&local_78,&local_60.super_arg,&local_88,&local_a0,
             (char (*) [236])
             "\n\n            Args:\n                vertices: Coordinates of the points forming the center line.\n                radius: Radius of the capsule.\n                inside: Whether the domain is inside the capsule or outside of it.\n        "
            );
  pybind11::object::~object((object *)&local_78);
  pybind11::class_<sdf_tools::sdf::SdfPlate,std::shared_ptr<sdf_tools::sdf::SdfPlate>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[97]>
            ((class_<sdf_tools::sdf::SdfPlate,std::shared_ptr<sdf_tools::sdf::SdfPlate>> *)&local_a0
             ,(m->super_object).super_handle.m_ptr,"Plate",&cStack_a8,
             (char (*) [97])
             "\n        Plate defined by one point on the surface and the normal vector, pointing inside.\n\n    "
            );
  local_60.super_arg.name = "point";
  local_60.super_arg._8_1_ = 2;
  local_88.name = "normal";
  local_88._8_1_ = 2;
  pybind11::detail::initimpl::constructor<sdf_tools::real3,_sdf_tools::real3>::
  execute<pybind11::class_<sdf_tools::sdf::SdfPlate,_std::shared_ptr<sdf_tools::sdf::SdfPlate>_>,_pybind11::arg,_pybind11::arg,_char[209],_0>
            ((class_<sdf_tools::sdf::SdfPlate,_std::shared_ptr<sdf_tools::sdf::SdfPlate>_> *)
             &local_a0,&local_60.super_arg,&local_88,
             (char (*) [209])
             "\n            Args:\n                point: One point on the plane.\n                normal: The normal vector (not necessarily normalized, but must be non-zero)\n                        pointing inside.\n        "
            );
  pybind11::object::~object((object *)&local_a0);
  pybind11::class_<sdf_tools::sdf::SdfSphere,std::shared_ptr<sdf_tools::sdf::SdfSphere>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[56]>
            ((class_<sdf_tools::sdf::SdfSphere,std::shared_ptr<sdf_tools::sdf::SdfSphere>> *)
             &local_78,(m->super_object).super_handle.m_ptr,"Sphere",&cStack_a8,
             (char (*) [56])"\n        Sphere defined by its center and radius.\n\n    ");
  local_60.super_arg.name = "center";
  local_60.super_arg._8_1_ = 2;
  local_88.name = "radius";
  local_88._8_1_ = 2;
  local_a0.name = "inside";
  local_a0._8_1_ = 2;
  pybind11::detail::initimpl::constructor<sdf_tools::real3,_float,_bool>::
  execute<pybind11::class_<sdf_tools::sdf::SdfSphere,_std::shared_ptr<sdf_tools::sdf::SdfSphere>_>,_pybind11::arg,_pybind11::arg,_pybind11::arg,_char[203],_0>
            ((class_<sdf_tools::sdf::SdfSphere,_std::shared_ptr<sdf_tools::sdf::SdfSphere>_> *)
             &local_78,&local_60.super_arg,&local_88,&local_a0,
             (char (*) [203])
             "\n\n            Args:\n                center: Center of the sphere.\n                radius: Radius of the sphere.\n                inside: Whether the domain is inside the sphere or outside of it.\n        "
            );
  pybind11::object::~object((object *)&local_78);
  pybind11::class_<sdf_tools::sdf::SdfUnion,std::shared_ptr<sdf_tools::sdf::SdfUnion>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[31]>
            ((class_<sdf_tools::sdf::SdfUnion,std::shared_ptr<sdf_tools::sdf::SdfUnion>> *)&local_a0
             ,(m->super_object).super_handle.m_ptr,"Union",&cStack_a8,(char (*) [31])0x13b513);
  local_60.super_arg.name = "a";
  local_60.super_arg._8_1_ = 2;
  local_88.name = "b";
  local_88._8_1_ = 2;
  pybind11::detail::initimpl::
  constructor<std::shared_ptr<sdf_tools::sdf::Sdf>,_std::shared_ptr<sdf_tools::sdf::Sdf>_>::
  execute<pybind11::class_<sdf_tools::sdf::SdfUnion,_std::shared_ptr<sdf_tools::sdf::SdfUnion>_>,_pybind11::arg,_pybind11::arg,_char[87],_0>
            ((class_<sdf_tools::sdf::SdfUnion,_std::shared_ptr<sdf_tools::sdf::SdfUnion>_> *)
             &local_a0,&local_60.super_arg,&local_88,
             (char (*) [87])
             "\n\n        Args:\n            a: The first sdf.\n            b: The second sdf.\n\n        "
            );
  pybind11::object::~object((object *)&local_a0);
  pybind11::class_<sdf_tools::sdf::SdfIntersection,std::shared_ptr<sdf_tools::sdf::SdfIntersection>>
  ::class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[38]>
            ((class_<sdf_tools::sdf::SdfIntersection,std::shared_ptr<sdf_tools::sdf::SdfIntersection>>
              *)&local_a0,(m->super_object).super_handle.m_ptr,"Intersection",&cStack_a8,
             (char (*) [38])"Intersection between two SDF objects.");
  local_60.super_arg.name = "a";
  local_60.super_arg._8_1_ = 2;
  local_88.name = "b";
  local_88._8_1_ = 2;
  pybind11::detail::initimpl::
  constructor<std::shared_ptr<sdf_tools::sdf::Sdf>,_std::shared_ptr<sdf_tools::sdf::Sdf>_>::
  execute<pybind11::class_<sdf_tools::sdf::SdfIntersection,_std::shared_ptr<sdf_tools::sdf::SdfIntersection>_>,_pybind11::arg,_pybind11::arg,_char[87],_0>
            ((class_<sdf_tools::sdf::SdfIntersection,_std::shared_ptr<sdf_tools::sdf::SdfIntersection>_>
              *)&local_a0,&local_60.super_arg,&local_88,
             (char (*) [87])
             "\n\n        Args:\n            a: The first sdf.\n            b: The second sdf.\n\n        "
            );
  pybind11::object::~object((object *)&local_a0);
  pybind11::class_<sdf_tools::sdf::SdfDifference,std::shared_ptr<sdf_tools::sdf::SdfDifference>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[36]>
            ((class_<sdf_tools::sdf::SdfDifference,std::shared_ptr<sdf_tools::sdf::SdfDifference>> *
             )&local_a0,(m->super_object).super_handle.m_ptr,"Difference",&cStack_a8,
             (char (*) [36])"Difference between two SDF objects.");
  local_60.super_arg.name = "a";
  local_60.super_arg._8_1_ = 2;
  local_88.name = "b";
  local_88._8_1_ = 2;
  pybind11::detail::initimpl::
  constructor<std::shared_ptr<sdf_tools::sdf::Sdf>,_std::shared_ptr<sdf_tools::sdf::Sdf>_>::
  execute<pybind11::class_<sdf_tools::sdf::SdfDifference,_std::shared_ptr<sdf_tools::sdf::SdfDifference>_>,_pybind11::arg,_pybind11::arg,_char[138],_0>
            ((class_<sdf_tools::sdf::SdfDifference,_std::shared_ptr<sdf_tools::sdf::SdfDifference>_>
              *)&local_a0,&local_60.super_arg,&local_88,
             (char (*) [138])
             "\n\n        Args:\n            a: The original sdf.\n            b: The sdf of the object that should be removed from the original.\n\n        "
            );
  pybind11::object::~object((object *)&local_a0);
  pybind11::class_<sdf_tools::sdf::SdfSmoothUnion,std::shared_ptr<sdf_tools::sdf::SdfSmoothUnion>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[38]>
            ((class_<sdf_tools::sdf::SdfSmoothUnion,std::shared_ptr<sdf_tools::sdf::SdfSmoothUnion>>
              *)&local_90,(m->super_object).super_handle.m_ptr,"SmoothUnion",&cStack_a8,
             (char (*) [38])"Smooth Union between two SDF objects.");
  local_88.name = "a";
  local_88._8_1_ = 2;
  local_a0.name = "b";
  local_a0._8_1_ = 2;
  local_64 = 32.0;
  local_78.name = "k";
  local_78._8_1_ = 2;
  pybind11::arg::operator=(&local_60,&local_78,&local_64);
  pybind11::detail::initimpl::
  constructor<std::shared_ptr<sdf_tools::sdf::Sdf>,_std::shared_ptr<sdf_tools::sdf::Sdf>,_float>::
  execute<pybind11::class_<sdf_tools::sdf::SdfSmoothUnion,_std::shared_ptr<sdf_tools::sdf::SdfSmoothUnion>_>,_pybind11::arg,_pybind11::arg,_pybind11::arg_v,_char[144],_0>
            ((class_<sdf_tools::sdf::SdfSmoothUnion,_std::shared_ptr<sdf_tools::sdf::SdfSmoothUnion>_>
              *)&local_90,&local_88,&local_a0,&local_60,
             (char (*) [144])
             "\n\n        Args:\n            a: The first sdf.\n            b: The second sdf.\n            k: The smoothing parameter. Must be positive.\n        "
            );
  pybind11::arg_v::~arg_v(&local_60);
  pybind11::object::~object((object *)&local_90);
  pybind11::class_<sdf_tools::sdf::SdfComplement,std::shared_ptr<sdf_tools::sdf::SdfComplement>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[31]>
            ((class_<sdf_tools::sdf::SdfComplement,std::shared_ptr<sdf_tools::sdf::SdfComplement>> *
             )&local_88,(m->super_object).super_handle.m_ptr,"Complement",&cStack_a8,
             (char (*) [31])"Reverse interior and exterior.");
  local_60.super_arg.name = "sdf";
  local_60.super_arg._8_1_ = 2;
  pybind11::detail::initimpl::constructor<std::shared_ptr<sdf_tools::sdf::Sdf>_>::
  execute<pybind11::class_<sdf_tools::sdf::SdfComplement,_std::shared_ptr<sdf_tools::sdf::SdfComplement>_>,_pybind11::arg,_char[61],_0>
            ((class_<sdf_tools::sdf::SdfComplement,_std::shared_ptr<sdf_tools::sdf::SdfComplement>_>
              *)&local_88,&local_60.super_arg,
             (char (*) [61])"\n\n        Args:\n            sdf: The original sdf.\n\n        ");
  pybind11::object::~object((object *)&local_88);
  pybind11::object::~object((object *)&cStack_a8);
  return;
}

Assistant:

void exportSdf(py::module& m)
{
    py::shared_class<Sdf> pysdf(m, "Sdf", R"(
        Base sdf class.
    )");

    pysdf.def("at", &Sdf::at,
              "r"_a, R"(
        Evaluate the SDF field at the given position.

        Args:
            r: The position where to evaluate the SDF.
    )");

    py::shared_class<SdfBox> (m, "Box", pysdf, R"(
        Box aligned with axes
    )")
        .def(py::init <real3, real3, bool> (),
             "low"_a, "high"_a, "inside"_a, R"(

            Args:
                low: Lower corner of the box.
                high: Upper corner of the box.
                inside: ``True`` if the interior is inside the given shape.
        )");

    py::shared_class<SdfCapsule> (m, "Capsule", pysdf, R"(
        Capsule defined by a segment and a radius.

    )")
        .def(py::init <real3, real3, real, bool> (),
             "start"_a, "end"_a, "radius"_a, "inside"_a, R"(

            Args:
                start: First end of the segment.
                end:  Second end of the segment.
                radius: Radius of the capsule.
                inside: Whether the domain is inside the capsule or outside of it.
        )");

    py::shared_class<SdfEdges> (m, "Edges", pysdf, R"(
        Closed polygon defined from edges in the xy plane.
    )")
        .def(py::init <std::vector<real2>&, bool, int> (),
             "edges"_a, "inside"_a, "nsamples"_a = 20, R"(

            Args:
                edges: List of vertices positions (2D).
                inside: ``True`` if the interior is inside the given shape.
                nsamples: Number of samples to find the sign of the SDF (more is more accurate).
        )");

    py::shared_class<SdfFromMesh> (m, "FromMesh", pysdf, R"(
        Closed triangle mesh.
    )")
        .def(py::init <std::vector<int3>, std::vector<real3>, bool> (),
             "faces"_a, "vertices"_a, "inside"_a, R"(

            Args:
                faces: List of vertex indices forming each face.
                vertices: List of vertices positions (3D).
                inside: ``True`` if the interior is inside the given shape.
        )");

    py::shared_class<SdfPiecewisePipe> (m, "PiecewisePipe", pysdf, R"(
        The union of many connected capsules, forming a piecewise linear pipe with a constant radius.

    )")
        .def(py::init <std::vector<real3>, real, bool> (),
             "vertices"_a, "radius"_a, "inside"_a, R"(

            Args:
                vertices: Coordinates of the points forming the center line.
                radius: Radius of the capsule.
                inside: Whether the domain is inside the capsule or outside of it.
        )");

    py::shared_class<SdfPlate> (m, "Plate", pysdf, R"(
        Plate defined by one point on the surface and the normal vector, pointing inside.

    )")
        .def(py::init <real3, real3> (),
             "point"_a, "normal"_a, R"(
            Args:
                point: One point on the plane.
                normal: The normal vector (not necessarily normalized, but must be non-zero)
                        pointing inside.
        )");

    py::shared_class<SdfSphere> (m, "Sphere", pysdf, R"(
        Sphere defined by its center and radius.

    )")
        .def(py::init <real3, real, bool> (),
             "center"_a, "radius"_a, "inside"_a, R"(

            Args:
                center: Center of the sphere.
                radius: Radius of the sphere.
                inside: Whether the domain is inside the sphere or outside of it.
        )");


    py::shared_class<SdfUnion> (m, "Union", pysdf, "Union between two SDF objects.")
        .def(py::init<std::shared_ptr<Sdf>, std::shared_ptr<Sdf>>(),
             "a"_a, "b"_a, R"(

        Args:
            a: The first sdf.
            b: The second sdf.

        )");

    py::shared_class<SdfIntersection> (m, "Intersection", pysdf, "Intersection between two SDF objects.")
        .def(py::init<std::shared_ptr<Sdf>, std::shared_ptr<Sdf>>(),
            "a"_a, "b"_a, R"(

        Args:
            a: The first sdf.
            b: The second sdf.

        )");

    py::shared_class<SdfDifference> (m, "Difference", pysdf, "Difference between two SDF objects.")
        .def(py::init<std::shared_ptr<Sdf>, std::shared_ptr<Sdf>>(),
            "a"_a, "b"_a, R"(

        Args:
            a: The original sdf.
            b: The sdf of the object that should be removed from the original.

        )");

    py::shared_class<SdfSmoothUnion> (m, "SmoothUnion", pysdf, "Smooth Union between two SDF objects.")
        .def(py::init<std::shared_ptr<Sdf>, std::shared_ptr<Sdf>, real>(),
             "a"_a, "b"_a, "k"_a=32.0_r, R"(

        Args:
            a: The first sdf.
            b: The second sdf.
            k: The smoothing parameter. Must be positive.
        )");

    py::shared_class<SdfComplement> (m, "Complement", pysdf, "Reverse interior and exterior.")
        .def(py::init<std::shared_ptr<Sdf>>(),
            "sdf"_a, R"(

        Args:
            sdf: The original sdf.

        )");

}